

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrti.h
# Opt level: O3

void __thiscall
SqrtiTest::SqrtiTest
          (SqrtiTest *this,input_generator_t *inputGenerator,input_range_t *inputRange,
          uint64_t samplesInRange)

{
  string local_68;
  _Any_data local_48;
  code *local_38;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"sqrti","");
  std::
  function<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_(const_std::pair<unsigned_int,_unsigned_int>_&,_unsigned_long)>
  ::function((function<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_(const_std::pair<unsigned_int,_unsigned_int>_&,_unsigned_long)>
              *)&local_48,inputGenerator);
  Test<unsigned_int,unsigned_int,double>::
  Test<unsigned_int(*)(unsigned_int),unsigned_int(*)(unsigned_int)>
            ((Test<unsigned_int,unsigned_int,double> *)this,&local_68,(input_generator_t *)&local_48
             ,*inputRange,samplesInRange,sqrti_reference,dummyFunc);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SqrtiTest(input_generator_t inputGenerator, const input_range_t& inputRange, uint64_t samplesInRange)
        : Test(
            "sqrti", inputGenerator,
            fixupInputRange(inputRange), samplesInRange, &sqrti_reference, &dummyFunc)
    {
    }